

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgunzip.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  FILE *__stream;
  FILE *__s;
  ulong uVar3;
  void *__ptr;
  size_t sVar4;
  void *dest;
  char *pcVar5;
  uint sourceLen;
  undefined4 uStack_38;
  uint outlen;
  
  _uStack_38 = in_RAX;
  puts("tgunzip 1.2.1 - example from the tiny inflate library (www.ibsensoftware.com)\n");
  if (argc != 3) {
    fputs("usage: tgunzip INFILE OUTFILE\n\nBoth input and output are kept in memory, so do not use this on huge files.\n"
          ,_stderr);
    return 1;
  }
  tinf_init();
  __stream = fopen(argv[1],"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (void *)0x0;
    printf_error("unable to open input file \'%s\'",argv[1]);
    iVar2 = 1;
    dest = (void *)0x0;
    goto LAB_00101393;
  }
  __s = fopen(argv[2],"wb");
  if (__s == (FILE *)0x0) {
    printf_error("unable to create output file \'%s\'",argv[2]);
LAB_00101378:
    __ptr = (void *)0x0;
    iVar2 = 1;
    dest = (void *)0x0;
  }
  else {
    fseek(__stream,0,2);
    uVar3 = ftell(__stream);
    fseek(__stream,0,0);
    sourceLen = (uint)uVar3;
    if (sourceLen < 0x12) {
      pcVar5 = "input too small to be gzip";
LAB_0010136e:
      printf_error(pcVar5);
      goto LAB_00101378;
    }
    uVar3 = uVar3 & 0xffffffff;
    __ptr = malloc(uVar3);
    if (__ptr == (void *)0x0) {
      pcVar5 = "not enough memory";
      goto LAB_0010136e;
    }
    sVar4 = fread(__ptr,1,uVar3,__stream);
    if (sVar4 == uVar3) {
      uVar1 = *(uint *)((long)__ptr + (ulong)(sourceLen - 4));
      dest = malloc((ulong)(uVar1 + (uVar1 == 0)));
      if (dest == (void *)0x0) {
        pcVar5 = "not enough memory";
        goto LAB_001013df;
      }
      _uStack_38 = CONCAT44(uVar1,uStack_38);
      iVar2 = tinf_gzip_uncompress(dest,&outlen,__ptr,sourceLen);
      if ((iVar2 != 0) || (outlen != uVar1)) {
        pcVar5 = "decompression failed";
        goto LAB_001013e2;
      }
      iVar2 = 0;
      printf("decompressed %u bytes\n",(ulong)uVar1);
      fwrite(dest,1,_uStack_38 >> 0x20,__s);
    }
    else {
      pcVar5 = "error reading input file";
LAB_001013df:
      dest = (void *)0x0;
LAB_001013e2:
      printf_error(pcVar5);
      iVar2 = 1;
    }
  }
  fclose(__stream);
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
LAB_00101393:
  free(__ptr);
  free(dest);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	FILE *fin = NULL;
	FILE *fout = NULL;
	unsigned char *source = NULL;
	unsigned char *dest = NULL;
	unsigned int len, dlen, outlen;
	int retval = EXIT_FAILURE;
	int res;

	printf("tgunzip " TINF_VER_STRING " - example from the tiny inflate library (www.ibsensoftware.com)\n\n");

	if (argc != 3) {
		fputs("usage: tgunzip INFILE OUTFILE\n\n"
		      "Both input and output are kept in memory, so do not use this on huge files.\n", stderr);
		return EXIT_FAILURE;
	}

	tinf_init();

	/* -- Open files -- */

	if ((fin = fopen(argv[1], "rb")) == NULL) {
		printf_error("unable to open input file '%s'", argv[1]);
		goto out;
	}

	if ((fout = fopen(argv[2], "wb")) == NULL) {
		printf_error("unable to create output file '%s'", argv[2]);
		goto out;
	}

	/* -- Read source -- */

	fseek(fin, 0, SEEK_END);

	len = ftell(fin);

	fseek(fin, 0, SEEK_SET);

	if (len < 18) {
		printf_error("input too small to be gzip");
		goto out;
	}

	source = (unsigned char *) malloc(len);

	if (source == NULL) {
		printf_error("not enough memory");
		goto out;
	}

	if (fread(source, 1, len, fin) != len) {
		printf_error("error reading input file");
		goto out;
	}

	/* -- Get decompressed length -- */

	dlen = read_le32(&source[len - 4]);

	dest = (unsigned char *) malloc(dlen ? dlen : 1);

	if (dest == NULL) {
		printf_error("not enough memory");
		goto out;
	}

	/* -- Decompress data -- */

	outlen = dlen;

	res = tinf_gzip_uncompress(dest, &outlen, source, len);

	if ((res != TINF_OK) || (outlen != dlen)) {
		printf_error("decompression failed");
		goto out;
	}

	printf("decompressed %u bytes\n", outlen);

	/* -- Write output -- */

	fwrite(dest, 1, outlen, fout);

	retval = EXIT_SUCCESS;

out:
	if (fin != NULL) {
		fclose(fin);
	}

	if (fout != NULL) {
		fclose(fout);
	}

	if (source != NULL) {
		free(source);
	}

	if (dest != NULL) {
		free(dest);
	}

	return retval;
}